

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

FT_Error FT_Add_Module(FT_Library library,FT_Module_Class *clazz)

{
  uint uVar1;
  char *__s2;
  FT_Module_Class *pFVar2;
  FT_Memory pFVar3;
  size_t __n;
  int iVar4;
  FT_Error FVar5;
  FT_Module pFVar6;
  ulong uVar7;
  FT_Driver driver;
  
  if (library == (FT_Library)0x0) {
    FVar5 = 0x21;
  }
  else if (clazz == (FT_Module_Class *)0x0) {
    FVar5 = 6;
  }
  else {
    FVar5 = 4;
    if (clazz->module_requires < 0x2000a) {
      uVar1 = library->num_modules;
      if ((ulong)uVar1 != 0) {
        __s2 = clazz->module_name;
        uVar7 = 0;
        do {
          pFVar6 = library->modules[uVar7];
          pFVar2 = pFVar6->clazz;
          iVar4 = strcmp(pFVar2->module_name,__s2);
          if (iVar4 == 0) {
            if (clazz->module_version <= pFVar2->module_version) {
              return 5;
            }
            FT_Remove_Module(library,pFVar6);
            break;
          }
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      FVar5 = 0x30;
      if (library->num_modules < 0x20) {
        pFVar3 = library->memory;
        __n = clazz->module_size;
        if ((long)__n < 1) {
          pFVar6 = (FT_Module)0x0;
          FVar5 = 6;
          if (__n == 0) {
            FVar5 = 0;
          }
        }
        else {
          pFVar6 = (FT_Module)(*pFVar3->alloc)(pFVar3,__n);
          FVar5 = (uint)(pFVar6 == (FT_Module)0x0) << 6;
        }
        if ((0 < (long)__n) && (FVar5 == 0)) {
          memset(pFVar6,0,__n);
        }
        if (FVar5 == 0) {
          pFVar6->library = library;
          pFVar6->memory = pFVar3;
          pFVar6->clazz = clazz;
          FVar5 = 0;
          if (((clazz->module_flags & 2) == 0) || (FVar5 = ft_add_renderer(pFVar6), FVar5 == 0)) {
            pFVar2 = pFVar6->clazz;
            uVar7 = pFVar2->module_flags;
            if ((uVar7 & 4) != 0) {
              library->auto_hinter = pFVar6;
            }
            if ((uVar7 & 1) != 0) {
              pFVar6[1].clazz = pFVar2;
            }
            if ((clazz->module_init == (FT_Module_Constructor)0x0) ||
               (FVar5 = (*clazz->module_init)(pFVar6), FVar5 == 0)) {
              uVar1 = library->num_modules;
              library->num_modules = uVar1 + 1;
              library->modules[uVar1] = pFVar6;
              return FVar5;
            }
          }
          if (((((pFVar6->clazz->module_flags & 2) != 0) &&
               (pFVar2 = pFVar6[1].clazz, pFVar2 != (FT_Module_Class *)0x0)) &&
              ((int)pFVar2[1].module_flags == 0x6f75746c)) && (pFVar6[4].library != (FT_Library)0x0)
             ) {
            (**(code **)((long)pFVar2[1].module_interface + 0x28))();
          }
          (*pFVar3->free)(pFVar3,pFVar6);
        }
      }
    }
  }
  return FVar5;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Add_Module( FT_Library              library,
                 const FT_Module_Class*  clazz )
  {
    FT_Error   error;
    FT_Memory  memory;
    FT_Module  module = NULL;
    FT_UInt    nn;


#define FREETYPE_VER_FIXED  ( ( (FT_Long)FREETYPE_MAJOR << 16 ) | \
                                FREETYPE_MINOR                  )

    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !clazz )
      return FT_THROW( Invalid_Argument );

    /* check FreeType version */
    if ( clazz->module_requires > FREETYPE_VER_FIXED )
      return FT_THROW( Invalid_Version );

    /* look for a module with the same name in the library's table */
    for ( nn = 0; nn < library->num_modules; nn++ )
    {
      module = library->modules[nn];
      if ( ft_strcmp( module->clazz->module_name, clazz->module_name ) == 0 )
      {
        /* this installed module has the same name, compare their versions */
        if ( clazz->module_version <= module->clazz->module_version )
          return FT_THROW( Lower_Module_Version );

        /* remove the module from our list, then exit the loop to replace */
        /* it by our new version..                                        */
        FT_Remove_Module( library, module );
        break;
      }
    }

    memory = library->memory;
    error  = FT_Err_Ok;

    if ( library->num_modules >= FT_MAX_MODULES )
    {
      error = FT_THROW( Too_Many_Drivers );
      goto Exit;
    }

    /* allocate module object */
    if ( FT_ALLOC( module, clazz->module_size ) )
      goto Exit;

    /* base initialization */
    module->library = library;
    module->memory  = memory;
    module->clazz   = (FT_Module_Class*)clazz;

    /* check whether the module is a renderer - this must be performed */
    /* before the normal module initialization                         */
    if ( FT_MODULE_IS_RENDERER( module ) )
    {
      /* add to the renderers list */
      error = ft_add_renderer( module );
      if ( error )
        goto Fail;
    }

    /* is the module a auto-hinter? */
    if ( FT_MODULE_IS_HINTER( module ) )
      library->auto_hinter = module;

    /* if the module is a font driver */
    if ( FT_MODULE_IS_DRIVER( module ) )
    {
      FT_Driver  driver = FT_DRIVER( module );


      driver->clazz = (FT_Driver_Class)module->clazz;
    }

    if ( clazz->module_init )
    {
      error = clazz->module_init( module );
      if ( error )
        goto Fail;
    }

    /* add module to the library's table */
    library->modules[library->num_modules++] = module;

  Exit:
    return error;

  Fail:
    if ( FT_MODULE_IS_RENDERER( module ) )
    {
      FT_Renderer  renderer = FT_RENDERER( module );


      if ( renderer->clazz                                          &&
           renderer->clazz->glyph_format == FT_GLYPH_FORMAT_OUTLINE &&
           renderer->raster                                         )
        renderer->clazz->raster_class->raster_done( renderer->raster );
    }

    FT_FREE( module );
    goto Exit;
  }